

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O1

QString * __thiscall
QXcbScreen::getOutputName
          (QString *__return_storage_ptr__,QXcbScreen *this,
          xcb_randr_get_output_info_reply_t *outputInfo)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  uint uVar3;
  char *__s;
  storage_type *psVar4;
  QArrayData *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (outputInfo == (xcb_randr_get_output_info_reply_t *)0x0) {
    defaultName(&local_38,this);
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.ptr = pcVar1;
    local_38.d.size = qVar2;
  }
  else {
    __s = (char *)xcb_randr_get_output_info_name(outputInfo);
    uVar3 = xcb_randr_get_output_info_name_length(outputInfo);
    psVar4 = (storage_type *)0x0;
    if (0 < (int)uVar3) {
      psVar4 = (storage_type *)(ulong)uVar3;
    }
    if (__s == (char *)0x0) {
      psVar4 = (storage_type *)0x0;
    }
    if (__s != (char *)0x0 && (int)uVar3 < 0) {
      psVar4 = (storage_type *)strlen(__s);
    }
    QVar6.m_data = psVar4;
    QVar6.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar6);
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.ptr = pcVar1;
    local_38.d.size = qVar2;
  }
  local_38.d.d = (Data *)pQVar5;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXcbScreen::getOutputName(xcb_randr_get_output_info_reply_t *outputInfo)
{
    QString name;
    if (outputInfo) {
        name = QString::fromUtf8((const char*)xcb_randr_get_output_info_name(outputInfo),
                                 xcb_randr_get_output_info_name_length(outputInfo));
    } else {
        name = defaultName();
    }
    return name;
}